

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(long lhs,SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  long ret;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_30;
  long local_28;
  long local_20;
  long local_18;
  
  local_30.m_int = 0;
  local_28 = lhs;
  bVar1 = DivisionCornerCaseHelper2<long,_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::DivisionCornerCase2(lhs,rhs,&local_30);
  local_18 = local_30.m_int;
  if (!bVar1) {
    local_18 = 0;
    local_20 = rhs.m_int;
    DivisionHelper<long,_long,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              (&local_28,&local_20,&local_18);
  }
  return (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_18;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}